

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

bool verify_Board(vector<Board,_std::allocator<Board>_> *puzzles,Board *board,int posi)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  Board local_80;
  Board *local_48;
  vector<Board,_std::allocator<Board>_> *local_40;
  int local_34;
  
  lVar4 = 0;
  uVar5 = 0;
  if (0 < posi) {
    uVar5 = (ulong)(uint)posi;
  }
  uVar1 = 0;
  local_48 = board;
  local_40 = puzzles;
  local_34 = posi;
  do {
    uVar3 = uVar1;
    if (uVar5 == uVar3) break;
    Board::Board(&local_80,
                 (Board *)((long)&(((local_40->super__Vector_base<Board,_std::allocator<Board>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->armada).
                                  super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl + lVar4));
    bVar2 = Board::operator==(local_48,&local_80);
    Board::~Board(&local_80);
    lVar4 = lVar4 + 0x38;
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  return (long)local_34 <= (long)uVar3;
}

Assistant:

bool verify_Board( std::vector< Board > &puzzles, Board board, int posi )
{
    for( int vec = 0; vec < posi; vec++ )
    {
        if( board == puzzles[vec] )
        {
            return false;
        }
    }

    return true;
}